

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::ByteSize(Extension *this,int number)

{
  bool bVar1;
  FieldType FVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  const_reference plVar6;
  const_reference puVar7;
  ulong *puVar8;
  const_reference puVar9;
  const_reference piVar10;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar11;
  undefined4 extraout_var;
  ulong uVar12;
  size_t sVar13;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar14;
  ulong uVar15;
  long lVar16;
  int i_7;
  RepeatedPtrFieldBase *pRVar17;
  int i;
  int iVar18;
  LogMessage LStack_38;
  
  if (this->is_repeated != true) {
    if ((this->field_0xa & 2) != 0) {
      return 0;
    }
    FVar2 = anon_unknown_59::real_type(this->type);
    sVar5 = WireFormatLite::TagSize(number,FVar2);
    FVar2 = anon_unknown_59::real_type(this->type);
    switch(FVar2) {
    case TYPE_DOUBLE:
    case TYPE_FIXED64:
    case TYPE_SFIXED64:
      return sVar5 + 8;
    case TYPE_FLOAT:
    case TYPE_FIXED32:
    case TYPE_SFIXED32:
      return sVar5 + 4;
    case TYPE_INT64:
    case TYPE_UINT64:
      uVar12 = (this->field_0).uint64_t_value;
      goto LAB_0020045d;
    case TYPE_INT32:
    case TYPE_ENUM:
      uVar12 = (ulong)(this->field_0).int32_t_value;
LAB_0020045d:
      lVar16 = 0x3f;
      if ((uVar12 | 1) != 0) {
        for (; (uVar12 | 1) >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      iVar18 = (int)lVar16;
LAB_00200465:
      uVar12 = (ulong)(iVar18 * 9 + 0x49U >> 6);
      break;
    case TYPE_BOOL:
      return sVar5 + 1;
    case TYPE_STRING:
    case TYPE_BYTES:
      uVar12 = WireFormatLite::StringSize((string *)this->field_0);
      break;
    case TYPE_GROUP:
      uVar12 = (**(code **)(*(long *)this->field_0 + 0x18))();
      break;
    case TYPE_MESSAGE:
      if ((this->field_0xa & 4) == 0) {
        lVar16 = (**(code **)(*(long *)this->field_0 + 0x18))();
      }
      else {
        lVar16 = (**(code **)(*(long *)this->field_0 + 0x68))();
      }
      uVar4 = (uint)lVar16 | 1;
      iVar18 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      return sVar5 + lVar16 + (ulong)(iVar18 * 9 + 0x49U >> 6);
    case TYPE_UINT32:
      uVar4 = (this->field_0).uint32_t_value | 1;
      iVar18 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      goto LAB_00200465;
    case TYPE_SINT32:
      uVar12 = WireFormatLite::SInt32Size((this->field_0).int32_t_value);
      break;
    case MAX_FIELD_TYPE:
      uVar12 = WireFormatLite::SInt64Size((this->field_0).int64_t_value);
      break;
    default:
      return sVar5;
    }
    goto LAB_0020068a;
  }
  bVar1 = this->is_packed;
  FVar2 = anon_unknown_59::real_type(this->type);
  if (bVar1 == true) {
    switch(FVar2) {
    case TYPE_DOUBLE:
      uVar4 = RepeatedField<double>::size((RepeatedField<double> *)this->field_0);
      goto LAB_00200617;
    case TYPE_FLOAT:
      uVar4 = RepeatedField<float>::size((RepeatedField<float> *)this->field_0);
      goto LAB_00200653;
    case TYPE_INT64:
      uVar15 = 0;
      for (iVar18 = 0; iVar3 = RepeatedField<long>::size(this->field_0), iVar18 < iVar3;
          iVar18 = iVar18 + 1) {
        puVar8 = (ulong *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar18);
        lVar16 = 0x3f;
        if ((*puVar8 | 1) != 0) {
          for (; (*puVar8 | 1) >> lVar16 == 0; lVar16 = lVar16 + -1) {
          }
        }
        uVar15 = uVar15 + ((int)lVar16 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_UINT64:
      uVar15 = 0;
      for (iVar18 = 0; iVar3 = RepeatedField<unsigned_long>::size(this->field_0), iVar18 < iVar3;
          iVar18 = iVar18 + 1) {
        puVar9 = RepeatedField<unsigned_long>::Get
                           ((RepeatedField<unsigned_long> *)this->field_0,iVar18);
        lVar16 = 0x3f;
        if ((*puVar9 | 1) != 0) {
          for (; (*puVar9 | 1) >> lVar16 == 0; lVar16 = lVar16 + -1) {
          }
        }
        uVar15 = uVar15 + ((int)lVar16 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_INT32:
      uVar15 = 0;
      for (iVar18 = 0; iVar3 = RepeatedField<int>::size(this->field_0), iVar18 < iVar3;
          iVar18 = iVar18 + 1) {
        piVar10 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar18);
        lVar16 = 0x3f;
        if (((long)*piVar10 | 1U) != 0) {
          for (; ((long)*piVar10 | 1U) >> lVar16 == 0; lVar16 = lVar16 + -1) {
          }
        }
        uVar15 = uVar15 + ((int)lVar16 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_FIXED64:
      uVar4 = RepeatedField<unsigned_long>::size((RepeatedField<unsigned_long> *)this->field_0);
      goto LAB_00200617;
    case TYPE_FIXED32:
      uVar4 = RepeatedField<unsigned_int>::size((RepeatedField<unsigned_int> *)this->field_0);
      goto LAB_00200653;
    case TYPE_BOOL:
      uVar4 = RepeatedField<bool>::size((RepeatedField<bool> *)this->field_0);
      uVar15 = (ulong)uVar4;
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x5e4);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&LStack_38,(char (*) [37])"Non-primitive types can\'t be packed.");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_38);
    case TYPE_UINT32:
      uVar15 = 0;
      for (iVar18 = 0; iVar3 = RepeatedField<unsigned_int>::size(this->field_0), iVar18 < iVar3;
          iVar18 = iVar18 + 1) {
        puVar7 = RepeatedField<unsigned_int>::Get
                           ((RepeatedField<unsigned_int> *)this->field_0,iVar18);
        iVar3 = 0x1f;
        if ((*puVar7 | 1) != 0) {
          for (; (*puVar7 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar15 = uVar15 + (iVar3 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_ENUM:
      uVar15 = 0;
      for (iVar18 = 0; iVar3 = RepeatedField<int>::size(this->field_0), iVar18 < iVar3;
          iVar18 = iVar18 + 1) {
        piVar10 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar18);
        lVar16 = 0x3f;
        if (((long)*piVar10 | 1U) != 0) {
          for (; ((long)*piVar10 | 1U) >> lVar16 == 0; lVar16 = lVar16 + -1) {
          }
        }
        uVar15 = uVar15 + ((int)lVar16 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_SFIXED32:
      uVar4 = RepeatedField<int>::size((RepeatedField<int> *)this->field_0);
LAB_00200653:
      uVar15 = (ulong)uVar4 << 2;
      break;
    case TYPE_SFIXED64:
      uVar4 = RepeatedField<long>::size((RepeatedField<long> *)this->field_0);
LAB_00200617:
      uVar15 = (ulong)uVar4 << 3;
      break;
    case TYPE_SINT32:
      uVar15 = 0;
      for (iVar18 = 0; iVar3 = RepeatedField<int>::size(this->field_0), iVar18 < iVar3;
          iVar18 = iVar18 + 1) {
        piVar10 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar18);
        sVar5 = WireFormatLite::SInt32Size(*piVar10);
        uVar15 = uVar15 + sVar5;
      }
      break;
    case MAX_FIELD_TYPE:
      uVar15 = 0;
      for (iVar18 = 0; iVar3 = RepeatedField<long>::size(this->field_0), iVar18 < iVar3;
          iVar18 = iVar18 + 1) {
        plVar6 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar18);
        sVar5 = WireFormatLite::SInt64Size(*plVar6);
        uVar15 = uVar15 + sVar5;
      }
      break;
    default:
      *(undefined4 *)(this->cached_size).int_ = 0;
      return 0;
    }
    *(uint *)(this->cached_size).int_ = (uint)uVar15;
    if (uVar15 == 0) {
switchD_002003fe_default:
      return 0;
    }
    uVar4 = (uint)uVar15 | 1;
    iVar18 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar18 == 0; iVar18 = iVar18 + -1) {
      }
    }
    uVar12 = (ulong)(iVar18 * 9 + 0x49U >> 6);
    uVar4 = number * 8 + 3;
    iVar18 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar18 == 0; iVar18 = iVar18 + -1) {
      }
    }
    sVar5 = uVar15 + (iVar18 * 9 + 0x49U >> 6);
LAB_0020068a:
    return sVar5 + uVar12;
  }
  sVar5 = WireFormatLite::TagSize(number,FVar2);
  FVar2 = anon_unknown_59::real_type(this->type);
  switch(FVar2) {
  case TYPE_DOUBLE:
    lVar16 = sVar5 + 8;
    uVar4 = RepeatedField<double>::size((RepeatedField<double> *)this->field_0);
    goto LAB_0020096c;
  case TYPE_FLOAT:
    lVar16 = sVar5 + 4;
    uVar4 = RepeatedField<float>::size((RepeatedField<float> *)this->field_0);
    goto LAB_0020096c;
  case TYPE_INT64:
    uVar4 = RepeatedField<long>::size((RepeatedField<long> *)this->field_0);
    sVar5 = sVar5 * uVar4;
    for (iVar18 = 0; iVar3 = RepeatedField<long>::size(this->field_0), iVar18 < iVar3;
        iVar18 = iVar18 + 1) {
      puVar8 = (ulong *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar18);
      lVar16 = 0x3f;
      if ((*puVar8 | 1) != 0) {
        for (; (*puVar8 | 1) >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar16 * 9 + 0x49U >> 6);
    }
    break;
  case TYPE_UINT64:
    uVar4 = RepeatedField<unsigned_long>::size((RepeatedField<unsigned_long> *)this->field_0);
    sVar5 = sVar5 * uVar4;
    for (iVar18 = 0; iVar3 = RepeatedField<unsigned_long>::size(this->field_0), iVar18 < iVar3;
        iVar18 = iVar18 + 1) {
      puVar9 = RepeatedField<unsigned_long>::Get
                         ((RepeatedField<unsigned_long> *)this->field_0,iVar18);
      lVar16 = 0x3f;
      if ((*puVar9 | 1) != 0) {
        for (; (*puVar9 | 1) >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar16 * 9 + 0x49U >> 6);
    }
    break;
  case TYPE_INT32:
    uVar4 = RepeatedField<int>::size((RepeatedField<int> *)this->field_0);
    sVar5 = sVar5 * uVar4;
    for (iVar18 = 0; iVar3 = RepeatedField<int>::size(this->field_0), iVar18 < iVar3;
        iVar18 = iVar18 + 1) {
      piVar10 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar18);
      lVar16 = 0x3f;
      if (((long)*piVar10 | 1U) != 0) {
        for (; ((long)*piVar10 | 1U) >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar16 * 9 + 0x49U >> 6);
    }
    break;
  case TYPE_FIXED64:
    lVar16 = sVar5 + 8;
    uVar4 = RepeatedField<unsigned_long>::size((RepeatedField<unsigned_long> *)this->field_0);
    goto LAB_0020096c;
  case TYPE_FIXED32:
    lVar16 = sVar5 + 4;
    uVar4 = RepeatedField<unsigned_int>::size((RepeatedField<unsigned_int> *)this->field_0);
    goto LAB_0020096c;
  case TYPE_BOOL:
    lVar16 = sVar5 + 1;
    uVar4 = RepeatedField<bool>::size((RepeatedField<bool> *)this->field_0);
    goto LAB_0020096c;
  case TYPE_STRING:
    pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    uVar12 = (ulong)(uint)pRVar17->current_size_;
    sVar5 = sVar5 * uVar12;
    for (iVar18 = 0; iVar18 < (int)uVar12; iVar18 = iVar18 + 1) {
      pVVar11 = RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (pRVar17,iVar18);
      sVar13 = WireFormatLite::StringSize(pVVar11);
      sVar5 = sVar5 + sVar13;
      pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      uVar12 = (ulong)(uint)pRVar17->current_size_;
    }
    break;
  case TYPE_GROUP:
    pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    uVar12 = (ulong)(uint)pRVar17->current_size_;
    sVar5 = sVar5 * uVar12;
    for (iVar18 = 0; iVar18 < (int)uVar12; iVar18 = iVar18 + 1) {
      pVVar14 = RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                          (pRVar17,iVar18);
      iVar3 = (*pVVar14->_vptr_MessageLite[3])(pVVar14);
      sVar5 = sVar5 + CONCAT44(extraout_var,iVar3);
      pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      uVar12 = (ulong)(uint)pRVar17->current_size_;
    }
    break;
  case TYPE_MESSAGE:
    pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    uVar12 = (ulong)(uint)pRVar17->current_size_;
    sVar5 = sVar5 * uVar12;
    for (iVar18 = 0; iVar18 < (int)uVar12; iVar18 = iVar18 + 1) {
      pVVar14 = RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                          (pRVar17,iVar18);
      sVar13 = WireFormatLite::MessageSize<google::protobuf::MessageLite>(pVVar14);
      sVar5 = sVar5 + sVar13;
      pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      uVar12 = (ulong)(uint)pRVar17->current_size_;
    }
    break;
  case TYPE_BYTES:
    pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    uVar12 = (ulong)(uint)pRVar17->current_size_;
    sVar5 = sVar5 * uVar12;
    for (iVar18 = 0; iVar18 < (int)uVar12; iVar18 = iVar18 + 1) {
      pVVar11 = RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (pRVar17,iVar18);
      sVar13 = WireFormatLite::StringSize(pVVar11);
      sVar5 = sVar5 + sVar13;
      pRVar17 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      uVar12 = (ulong)(uint)pRVar17->current_size_;
    }
    break;
  case TYPE_UINT32:
    uVar4 = RepeatedField<unsigned_int>::size((RepeatedField<unsigned_int> *)this->field_0);
    sVar5 = sVar5 * uVar4;
    for (iVar18 = 0; iVar3 = RepeatedField<unsigned_int>::size(this->field_0), iVar18 < iVar3;
        iVar18 = iVar18 + 1) {
      puVar7 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)this->field_0,iVar18)
      ;
      iVar3 = 0x1f;
      if ((*puVar7 | 1) != 0) {
        for (; (*puVar7 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar5 = sVar5 + (iVar3 * 9 + 0x49U >> 6);
    }
    break;
  case TYPE_ENUM:
    uVar4 = RepeatedField<int>::size((RepeatedField<int> *)this->field_0);
    sVar5 = sVar5 * uVar4;
    for (iVar18 = 0; iVar3 = RepeatedField<int>::size(this->field_0), iVar18 < iVar3;
        iVar18 = iVar18 + 1) {
      piVar10 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar18);
      lVar16 = 0x3f;
      if (((long)*piVar10 | 1U) != 0) {
        for (; ((long)*piVar10 | 1U) >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar16 * 9 + 0x49U >> 6);
    }
    break;
  case TYPE_SFIXED32:
    lVar16 = sVar5 + 4;
    uVar4 = RepeatedField<int>::size((RepeatedField<int> *)this->field_0);
    goto LAB_0020096c;
  case TYPE_SFIXED64:
    lVar16 = sVar5 + 8;
    uVar4 = RepeatedField<long>::size((RepeatedField<long> *)this->field_0);
LAB_0020096c:
    sVar5 = lVar16 * (ulong)uVar4;
    break;
  case TYPE_SINT32:
    uVar4 = RepeatedField<int>::size((RepeatedField<int> *)this->field_0);
    sVar5 = sVar5 * uVar4;
    for (iVar18 = 0; iVar3 = RepeatedField<int>::size(this->field_0), iVar18 < iVar3;
        iVar18 = iVar18 + 1) {
      piVar10 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar18);
      sVar13 = WireFormatLite::SInt32Size(*piVar10);
      sVar5 = sVar5 + sVar13;
    }
    break;
  case MAX_FIELD_TYPE:
    uVar4 = RepeatedField<long>::size((RepeatedField<long> *)this->field_0);
    sVar5 = sVar5 * uVar4;
    for (iVar18 = 0; iVar3 = RepeatedField<long>::size(this->field_0), iVar18 < iVar3;
        iVar18 = iVar18 + 1) {
      plVar6 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar18);
      sVar13 = WireFormatLite::SInt64Size(*plVar6);
      sVar5 = sVar5 + sVar13;
    }
    break;
  default:
    goto switchD_002003fe_default;
  }
  return sVar5;
}

Assistant:

size_t ExtensionSet::Extension::ByteSize(int number) const {
  size_t result = 0;

  if (is_repeated) {
    if (is_packed) {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      result += WireFormatLite::CAMELCASE##Size(                         \
          ptr.repeated_##LOWERCASE##_value->Get(i));                     \
    }                                                                    \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                 \
  case WireFormatLite::TYPE_##UPPERCASE:                             \
    result += WireFormatLite::k##CAMELCASE##Size *                   \
              FromIntSize(ptr.repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          ABSL_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }

      cached_size.set(ToCachedSize(result));
      if (result > 0) {
        result += io::CodedOutputStream::VarintSize32(result);
        result += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
      }
    } else {
      size_t tag_size = WireFormatLite::TagSize(number, real_type(type));

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                      \
  case WireFormatLite::TYPE_##UPPERCASE:                                  \
    result +=                                                             \
        tag_size * FromIntSize(ptr.repeated_##LOWERCASE##_value->size()); \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) {  \
      result += WireFormatLite::CAMELCASE##Size(                          \
          ptr.repeated_##LOWERCASE##_value->Get(i));                      \
    }                                                                     \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(STRING, String, string);
        HANDLE_TYPE(BYTES, Bytes, string);
        HANDLE_TYPE(ENUM, Enum, enum);
        HANDLE_TYPE(GROUP, Group, message);
        HANDLE_TYPE(MESSAGE, Message, message);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                 \
  case WireFormatLite::TYPE_##UPPERCASE:                             \
    result += (tag_size + WireFormatLite::k##CAMELCASE##Size) *      \
              FromIntSize(ptr.repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    result += WireFormatLite::TagSize(number, real_type(type));
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)      \
  case WireFormatLite::TYPE_##UPPERCASE:                  \
    result += WireFormatLite::CAMELCASE##Size(LOWERCASE); \
    break

      HANDLE_TYPE(INT32, Int32, int32_t_value);
      HANDLE_TYPE(INT64, Int64, int64_t_value);
      HANDLE_TYPE(UINT32, UInt32, uint32_t_value);
      HANDLE_TYPE(UINT64, UInt64, uint64_t_value);
      HANDLE_TYPE(SINT32, SInt32, int32_t_value);
      HANDLE_TYPE(SINT64, SInt64, int64_t_value);
      HANDLE_TYPE(STRING, String, *ptr.string_value);
      HANDLE_TYPE(BYTES, Bytes, *ptr.string_value);
      HANDLE_TYPE(ENUM, Enum, enum_value);
      HANDLE_TYPE(GROUP, Group, *ptr.message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE: {
        result += WireFormatLite::LengthDelimitedSize(
            is_lazy ? ptr.lazymessage_value->ByteSizeLong()
                    : ptr.message_value->ByteSizeLong());
        break;
      }

      // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE)         \
  case WireFormatLite::TYPE_##UPPERCASE:          \
    result += WireFormatLite::k##CAMELCASE##Size; \
    break
        HANDLE_TYPE(FIXED32, Fixed32);
        HANDLE_TYPE(FIXED64, Fixed64);
        HANDLE_TYPE(SFIXED32, SFixed32);
        HANDLE_TYPE(SFIXED64, SFixed64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE
    }
  }

  return result;
}